

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

void __thiscall choc::value::Value::Value(Value *this,Type *t)

{
  pointer puVar1;
  undefined8 uVar2;
  size_t __n;
  allocator_type local_11;
  
  __n = Type::getValueDataSize(t);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->packedData,__n,&local_11);
  (this->dictionary).super_StringDictionary._vptr_StringDictionary =
       (_func_int **)&PTR__SimpleStringDictionary_002f65c0;
  (this->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dictionary).strings.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = (this->packedData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->value).type.mainType = t->mainType;
  uVar2 = *(undefined8 *)((long)&t->content + 8);
  (this->value).type.content.object = (t->content).object;
  *(undefined8 *)((long)&(this->value).type.content + 8) = uVar2;
  (this->value).type.allocator = t->allocator;
  t->mainType = void_;
  (this->value).data = puVar1;
  (this->value).stringDictionary = &(this->dictionary).super_StringDictionary;
  return;
}

Assistant:

inline Value::Value (Type&& t)
   : packedData (static_cast<std::vector<char>::size_type> (t.getValueDataSize())),
     value (std::move (t), packedData.data(), std::addressof (dictionary))
{
}